

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::BufferView>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  Environment *this;
  VkAllocationCallbacks **this_00;
  RefData<vk::Handle<(vk::HandleType)12>_> data;
  RefData<vk::Handle<(vk::HandleType)12>_> data_00;
  RefData<vk::Handle<(vk::HandleType)12>_> data_01;
  RefData<vk::Handle<(vk::HandleType)12>_> data_02;
  allocator<char> local_251;
  string local_250;
  Move<vk::Handle<(vk::HandleType)12>_> local_230;
  RefData<vk::Handle<(vk::HandleType)12>_> local_210;
  undefined1 local_1f0 [8];
  Unique<vk::Handle<(vk::HandleType)12>_> obj3;
  RefData<vk::Handle<(vk::HandleType)12>_> local_1b0;
  undefined1 local_190 [8];
  Unique<vk::Handle<(vk::HandleType)12>_> obj2;
  RefData<vk::Handle<(vk::HandleType)12>_> local_150;
  undefined1 local_130 [8];
  Unique<vk::Handle<(vk::HandleType)12>_> obj1;
  Move<vk::Handle<(vk::HandleType)12>_> local_100;
  RefData<vk::Handle<(vk::HandleType)12>_> local_e0;
  undefined1 local_c0 [8];
  Unique<vk::Handle<(vk::HandleType)12>_> obj0;
  Resources res;
  Environment env;
  Context *context_local;
  
  this = (Environment *)
         &res.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator
  ;
  Environment::Environment(this,context,4);
  this_00 = &obj0.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  BufferView::Resources::Resources((Resources *)this_00,this,&params);
  BufferView::create(&local_100,this,(Resources *)this_00,&params);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_e0,(Move *)&local_100);
  data.deleter.m_deviceIface = local_e0.deleter.m_deviceIface;
  data.object.m_internal = local_e0.object.m_internal;
  data.deleter.m_device = local_e0.deleter.m_device;
  data.deleter.m_allocator = local_e0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)12>_> *)local_c0,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::~Move(&local_100);
  BufferView::create((Move<vk::Handle<(vk::HandleType)12>_> *)
                     &obj2.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator
                     ,(Environment *)
                      &res.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.
                       deleter.m_allocator,
                     (Resources *)
                     &obj0.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator
                     ,&params);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_150,
             (Move *)&obj2.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator
            );
  data_00.deleter.m_deviceIface = local_150.deleter.m_deviceIface;
  data_00.object.m_internal = local_150.object.m_internal;
  data_00.deleter.m_device = local_150.deleter.m_device;
  data_00.deleter.m_allocator = local_150.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)12>_> *)local_130,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)12>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator);
  BufferView::create((Move<vk::Handle<(vk::HandleType)12>_> *)
                     &obj3.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator
                     ,(Environment *)
                      &res.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.
                       deleter.m_allocator,
                     (Resources *)
                     &obj0.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator
                     ,&params);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_1b0,
             (Move *)&obj3.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator
            );
  data_01.deleter.m_deviceIface = local_1b0.deleter.m_deviceIface;
  data_01.object.m_internal = local_1b0.object.m_internal;
  data_01.deleter.m_device = local_1b0.deleter.m_device;
  data_01.deleter.m_allocator = local_1b0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)12>_> *)local_190,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)12>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator);
  BufferView::create(&local_230,
                     (Environment *)
                     &res.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter
                      .m_allocator,
                     (Resources *)
                     &obj0.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator
                     ,&params);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_210,(Move *)&local_230);
  data_02.deleter.m_deviceIface = local_210.deleter.m_deviceIface;
  data_02.object.m_internal = local_210.object.m_internal;
  data_02.deleter.m_device = local_210.deleter.m_device;
  data_02.deleter.m_allocator = local_210.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)12>_> *)local_1f0,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::~Move(&local_230);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)12>_> *)local_1f0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)12>_> *)local_190);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)12>_> *)local_130);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)12>_> *)local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"Ok",&local_251);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  BufferView::Resources::~Resources
            ((Resources *)
             &obj0.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}